

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O0

ostream * tcu::Format::operator<<
                    (ostream *str,
                    Array<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                    *fmt)

{
  bool bVar1;
  reference piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> cur;
  Array<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_> *fmt_local;
  ostream *str_local;
  
  cur._M_current = (int *)fmt;
  std::operator<<(str,"{ ");
  local_20._M_current = *cur._M_current;
  while (bVar1 = __gnu_cxx::operator!=
                           (&local_20,
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            (cur._M_current + 2)), bVar1) {
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       cur._M_current);
    if (bVar1) {
      std::operator<<(str,", ");
    }
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_20);
    std::ostream::operator<<(str,*piVar2);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_20);
  }
  std::operator<<(str," }");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}